

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O3

string * __thiscall
CLI::detail::
generate_set<std::map<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_10::test()::tstruct,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_10::test()::tstruct>>>>
          (string *__return_storage_ptr__,detail *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tstruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tstruct>_>_>
          *set)

{
  long lVar1;
  long lVar2;
  _Rb_tree_node_base *p_Var3;
  string *psVar4;
  _Self __tmp;
  _Rb_tree_node_base *p_Var5;
  ostringstream s;
  char *local_208;
  long local_200;
  char local_1f8 [16];
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  undefined1 *local_1c8;
  undefined1 local_1b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  local_208 = local_1f8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,",","");
  ::std::__cxx11::ostringstream::ostringstream(local_1a8);
  p_Var5 = *(_Rb_tree_node_base **)(this + 0x18);
  lVar1 = ::std::ostream::tellp();
  if (p_Var5 != (_Rb_tree_node_base *)(this + 8)) {
    do {
      lVar2 = ::std::ostream::tellp();
      if (lVar1 < lVar2) {
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_208,local_200);
        lVar1 = lVar2;
      }
      p_Var3 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var5);
      local_1e8 = local_1d8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,*(long *)(p_Var5 + 1),
                 (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1e8,local_1e0)
      ;
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8);
      }
      p_Var5 = p_Var3;
    } while (p_Var3 != (_Rb_tree_node_base *)(this + 8));
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1c8);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208);
  }
  psVar4 = (string *)::std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return psVar4;
}

Assistant:

std::string generate_set(const T &set) {
    using element_t = typename detail::element_type<T>::type;
    using iteration_type_t = typename detail::pair_adaptor<element_t>::value_type;  // the type of the object pair
    std::string out(1, '{');
    out.append(detail::join(
        detail::smart_deref(set),
        [](const iteration_type_t &v) { return detail::pair_adaptor<element_t>::first(v); },
        ","));
    out.push_back('}');
    return out;
}